

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_CreateDescriptor_sh_wsh_sortedmulti_Test::
Descriptor_CreateDescriptor_sh_wsh_sortedmulti_Test
          (Descriptor_CreateDescriptor_sh_wsh_sortedmulti_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005bf188;
  return;
}

Assistant:

TEST(Descriptor, CreateDescriptor_sh_wsh_sortedmulti) {
  std::string ext_descriptor = "sh(wsh(sortedmulti(2,xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*,xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*,[1422fcb3/0'/0'/68']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995)))";

  std::vector<DescriptorScriptType> type_list;
  type_list.push_back(DescriptorScriptType::kDescriptorScriptSh);
  type_list.push_back(DescriptorScriptType::kDescriptorScriptWsh);
  type_list.push_back(DescriptorScriptType::kDescriptorScriptSortedMulti);
  std::vector<DescriptorKeyInfo> key_list;
  key_list.emplace_back(DescriptorKeyInfo("xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*"));
  key_list.emplace_back(DescriptorKeyInfo("xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*"));
  key_list.emplace_back(DescriptorKeyInfo("02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995", "[1422fcb3/0'/0'/68']"));

  Descriptor desc;
  std::string desc_str = "";
  EXPECT_NO_THROW(desc = Descriptor::CreateDescriptor(type_list, key_list, 2));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_STREQ(desc_str.c_str(), ext_descriptor.c_str());
}